

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

QSize __thiscall QtMWidgets::AbstractScrollArea::minimumSizeHint(AbstractScrollArea *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  AbstractScrollAreaPrivate *pAVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  QSize QVar10;
  int iVar11;
  QWidget local_38 [8];
  
  uVar9 = (**(code **)(*(long *)((this->d).d)->viewport + 0x78))();
  pAVar5 = (this->d).d;
  iVar1 = pAVar5->left;
  iVar2 = pAVar5->right;
  iVar3 = pAVar5->top;
  iVar4 = pAVar5->bottom;
  iVar6 = QFrame::frameWidth();
  iVar7 = QFrame::frameWidth();
  if ((uVar9 & 0x8000000080000000) == 0) {
    iVar11 = (int)(uVar9 >> 0x20);
  }
  else {
    QWidget::fontMetrics(local_38);
    iVar8 = QFontMetrics::height();
    iVar11 = 10;
    if (10 < iVar8) {
      iVar11 = iVar8;
    }
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_38);
    uVar9 = (ulong)(uint)(iVar11 * 6);
    iVar11 = iVar11 << 2;
  }
  QVar10.wd = iVar2 + iVar1 + iVar6 * 2 + (int)uVar9;
  QVar10.ht = iVar4 + iVar3 + iVar7 * 2 + iVar11;
  return QVar10;
}

Assistant:

QSize
AbstractScrollArea::minimumSizeHint() const
{
	QSize viewportSizeHint = d->viewport->minimumSizeHint();
	const QSize marginsSize = QSize( d->left + d->right, d->top + d->bottom );
	const QSize frameSize = QSize( frameWidth() * 2, frameWidth() * 2 );

	if( !viewportSizeHint.isValid() )
	{
		const int h = qMax( 10, fontMetrics().height() );
		viewportSizeHint = QSize( 6 * h, 4 * h );
	}

	return viewportSizeHint + marginsSize + frameSize;
}